

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
          (internal *this,char *lhs_expression,char *rhs_expression,
          SquareMatrix<std::complex<float>_> *lhs,SquareMatrix<std::complex<float>_> *rhs)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  long lVar4;
  long lVar5;
  complex<float> *pcVar6;
  complex<float> *pcVar7;
  bool bVar8;
  undefined1 *puVar9;
  complex<float> *pcVar11;
  complex<float> *pcVar12;
  long lVar13;
  long lVar14;
  AssertionResult AVar15;
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Var10;
  
  lVar4 = rhs->size_;
  lVar5 = lhs->size_;
  if (lVar4 == lVar5) {
    bVar8 = lVar5 < 1;
    if (lVar5 < 1) {
LAB_00161265:
      if (bVar8) {
        AVar15 = AssertionSuccess();
        _Var10._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )AVar15.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
        goto LAB_0016128b;
      }
    }
    else {
      pcVar6 = (rhs->data_)._M_t.
               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
      pcVar7 = (lhs->data_)._M_t.
               super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
               .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
      if ((((*(float *)&pcVar6->_M_value == *(float *)&pcVar7->_M_value) &&
           (!NAN(*(float *)&pcVar6->_M_value) && !NAN(*(float *)&pcVar7->_M_value))) &&
          (fVar3 = *(float *)((long)&pcVar6->_M_value + 4),
          puVar9 = (undefined1 *)((long)&pcVar7->_M_value + 4), fVar3 == *(float *)puVar9)) &&
         (!NAN(fVar3) && !NAN(*(float *)puVar9))) {
        lVar14 = 0;
        bVar8 = false;
        pcVar11 = pcVar7;
        pcVar12 = pcVar6;
        do {
          lVar13 = 0;
          while( true ) {
            if (lVar5 + -1 == lVar13) goto LAB_00161225;
            lVar1 = lVar13 + 1;
            if ((*(float *)&pcVar12[lVar13 + 1]._M_value != *(float *)&pcVar11[lVar13 + 1]._M_value)
               || (NAN(*(float *)&pcVar12[lVar13 + 1]._M_value) ||
                   NAN(*(float *)&pcVar11[lVar13 + 1]._M_value))) break;
            fVar3 = *(float *)((long)&pcVar12[lVar13 + 1]._M_value + 4);
            pfVar2 = (float *)((long)&pcVar11[lVar13 + 1]._M_value + 4);
            if ((fVar3 != *pfVar2) || (lVar13 = lVar1, NAN(fVar3) || NAN(*pfVar2))) break;
          }
          if (lVar1 < lVar5) goto LAB_00161265;
LAB_00161225:
          lVar14 = lVar14 + 1;
          bVar8 = lVar5 <= lVar14;
          if (lVar14 == lVar5) goto LAB_00161265;
          if ((*(float *)&pcVar6[lVar14 * lVar4]._M_value !=
               *(float *)&pcVar7[lVar14 * lVar5]._M_value) ||
             (NAN(*(float *)&pcVar6[lVar14 * lVar4]._M_value) ||
              NAN(*(float *)&pcVar7[lVar14 * lVar5]._M_value))) goto LAB_00161265;
          fVar3 = *(float *)((long)&pcVar6[lVar14 * lVar4]._M_value + 4);
          pcVar12 = pcVar12 + lVar4;
          pcVar11 = pcVar11 + lVar5;
          pfVar2 = (float *)((long)&pcVar7[lVar14 * lVar5]._M_value + 4);
          if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) goto LAB_00161265;
        } while( true );
      }
    }
  }
  AVar15 = CmpHelperEQFailure<qclab::dense::SquareMatrix<std::complex<float>>,qclab::dense::SquareMatrix<std::complex<float>>>
                     (this,lhs_expression,rhs_expression,lhs,rhs);
  _Var10._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )AVar15.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
LAB_0016128b:
  AVar15.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var10._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  AVar15._0_8_ = this;
  return AVar15;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression, const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}